

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

JDIMENSION get_memory_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  undefined8 uVar1;
  long in_RSI;
  long in_RDI;
  JDIMENSION source_row;
  tga_source_ptr source;
  
  uVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                    (in_RDI,*(undefined8 *)(in_RSI + 0x40),
                     (*(int *)(in_RDI + 0x34) - *(int *)(in_RSI + 0x48)) + -1,1,0);
  *(undefined8 *)(in_RSI + 0x20) = uVar1;
  *(int *)(in_RSI + 0x48) = *(int *)(in_RSI + 0x48) + 1;
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_memory_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  JDIMENSION source_row;

  /* Compute row of source that maps to current_row of normal order */
  /* For now, assume image is bottom-up and not interlaced. */
  /* NEEDS WORK to support interlaced images! */
  source_row = cinfo->image_height - source->current_row - 1;

  /* Fetch that row from virtual array */
  source->pub.buffer = (*cinfo->mem->access_virt_sarray)
    ((j_common_ptr)cinfo, source->whole_image,
     source_row, (JDIMENSION)1, FALSE);

  source->current_row++;
  return 1;
}